

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O2

void __thiscall APITests::test_out_in_init_high(APITests *this)

{
  int iVar1;
  allocator local_71;
  string local_70;
  string local_50;
  string local_30;
  
  GPIO::setmode(BOARD);
  GPIO::setup((this->pin_data).out_a,OUT,1);
  GPIO::setup((this->pin_data).in_a,IN,-1);
  iVar1 = GPIO::input((this->pin_data).in_a);
  std::__cxx11::string::string((string *)&local_30,"",&local_71);
  assert::is_true(iVar1 == 1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  GPIO::output((this->pin_data).out_a,0);
  iVar1 = GPIO::input((this->pin_data).in_a);
  std::__cxx11::string::string((string *)&local_50,"",&local_71);
  assert::is_true(iVar1 == 0,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  GPIO::output((this->pin_data).out_a,1);
  iVar1 = GPIO::input((this->pin_data).in_a);
  std::__cxx11::string::string((string *)&local_70,"",&local_71);
  assert::is_true(iVar1 == 1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  GPIO::cleanup();
  return;
}

Assistant:

void test_out_in_init_high()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.out_a, GPIO::OUT, GPIO::HIGH);
        GPIO::setup(pin_data.in_a, GPIO::IN);

        auto val = GPIO::input(pin_data.in_a);
        assert::is_true(val == GPIO::HIGH);

        GPIO::output(pin_data.out_a, GPIO::LOW);
        val = GPIO::input(pin_data.in_a);
        assert::is_true(val == GPIO::LOW);

        GPIO::output(pin_data.out_a, GPIO::HIGH);
        val = GPIO::input(pin_data.in_a);
        assert::is_true(val == GPIO::HIGH);

        GPIO::cleanup();
    }